

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O1

double soplex::maxPrescaledRatio<double>
                 (SPxLPBase<double> *lp,vector<double,_std::allocator<double>_> *coScaleval,
                 bool rowRatio)

{
  double dVar1;
  uint uVar2;
  Tolerances *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  LPRowSetBase<double> *pLVar3;
  double dVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  undefined3 in_register_00000011;
  long *plVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  Real RVar13;
  double dVar14;
  double local_90;
  double local_88;
  double local_80;
  
  pLVar3 = (LPRowSetBase<double> *)&lp->super_LPColSetBase<double>;
  if (CONCAT31(in_register_00000011,rowRatio) != 0) {
    pLVar3 = &lp->super_LPRowSetBase<double>;
  }
  uVar2 = (pLVar3->super_SVSetBase<double>).set.thenum;
  if ((int)uVar2 < 1) {
    local_90 = 0.0;
  }
  else {
    pdVar5 = (double *)__tls_get_addr(&PTR_003b6b60);
    dVar1 = *pdVar5;
    lVar6 = 0xe8;
    if (rowRatio) {
      lVar6 = 0x20;
    }
    lVar7 = 0xf0;
    if (rowRatio) {
      lVar7 = 0x28;
    }
    local_90 = 0.0;
    uVar11 = 0;
    do {
      plVar8 = (long *)((long)*(int *)(*(long *)((long)&(lp->super_LPRowSetBase<double>).
                                                        super_SVSetBase<double>.
                                                        super_ClassArray<soplex::Nonzero<double>_>.
                                                        _vptr_ClassArray + lVar7) + 4 + uVar11 * 8)
                        * 0x28 + *(long *)((long)&(lp->super_LPRowSetBase<double>).
                                                  super_SVSetBase<double>.
                                                  super_ClassArray<soplex::Nonzero<double>_>.
                                                  _vptr_ClassArray + lVar6));
      ::soplex::infinity::__tls_init();
      local_80 = dVar1;
      if (*(int *)((long)plVar8 + 0xc) < 1) {
        local_88 = 0.0;
      }
      else {
        local_88 = 0.0;
        lVar10 = 8;
        lVar9 = 0;
        do {
          dVar12 = ABS(*(double *)(*plVar8 + -8 + lVar10)) *
                   (coScaleval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[*(uint *)(*plVar8 + lVar10)];
          this = (lp->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_00 = (lp->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          RVar13 = Tolerances::epsilon(this);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          dVar4 = local_88;
          if (RVar13 < ABS(dVar12)) {
            dVar14 = dVar12;
            if (local_80 <= dVar12) {
              dVar14 = local_80;
            }
            dVar4 = dVar12;
            local_80 = dVar14;
            if (dVar12 <= local_88) {
              dVar4 = local_88;
            }
          }
          local_88 = dVar4;
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x10;
        } while (lVar9 < *(int *)((long)plVar8 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      if (((local_80 != dVar1) || (dVar12 = local_90, NAN(local_80) || NAN(dVar1))) &&
         (dVar12 = local_88 / local_80, local_88 / local_80 <= local_90)) {
        dVar12 = local_90;
      }
      local_90 = dVar12;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar2);
  }
  return local_90;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}